

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseBinaryOp.h
# Opt level: O2

void __thiscall
Eigen::
CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>_>
::CwiseBinaryOp(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>
                *this,Lhs *aLhs,Rhs *aRhs,scalar_sum_op<double,_double> *func)

{
  RhsNested pMVar1;
  long lVar2;
  
  pMVar1 = aLhs->m_rhs;
  (this->m_lhs).m_lhs = aLhs->m_lhs;
  (this->m_lhs).m_rhs = pMVar1;
  (this->m_rhs).m_colFactor.m_value = (aRhs->m_colFactor).m_value;
  lVar2 = (aRhs->m_rowFactor).m_value;
  (this->m_rhs).m_matrix = aRhs->m_matrix;
  (this->m_rhs).m_rowFactor.m_value = lVar2;
  if (((aLhs->m_lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
       m_rows == (aRhs->m_rowFactor).m_value *
                 (aRhs->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_rows) &&
     ((aLhs->m_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
      m_cols == (aRhs->m_colFactor).m_value *
                (aRhs->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_cols)) {
    return;
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x6e,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>, const Eigen::Replicate<Eigen::Matrix<double, -1, -1>, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>, Rhs = const Eigen::Replicate<Eigen::Matrix<double, -1, -1>, -1, -1>]"
               );
}

Assistant:

CwiseBinaryOp(const Lhs& aLhs, const Rhs& aRhs, const BinaryOp& func = BinaryOp())
      : m_lhs(aLhs), m_rhs(aRhs), m_functor(func)
    {
      EIGEN_CHECK_BINARY_COMPATIBILIY(BinaryOp,typename Lhs::Scalar,typename Rhs::Scalar);
      // require the sizes to match
      EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(Lhs, Rhs)
      eigen_assert(aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols());
    }